

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrVisibilityMaskKHR *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *this;
  string type_prefix;
  string indices_prefix;
  string indexcountoutput_prefix;
  string indexcapacityinput_prefix;
  string vertices_prefix;
  string vertexcountoutput_prefix;
  string vertexcapacityinput_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  string local_928;
  ostringstream oss_vertexCapacityInput;
  ostringstream oss_vertices;
  uint auStack_770 [88];
  ostringstream oss_indices;
  ostringstream oss_indexCountOutput;
  ostringstream oss_indexCapacityInput;
  ostringstream oss_vertexCountOutput;
  
  PointerToHexString<XrVisibilityMaskKHR>((XrVisibilityMaskKHR *)type_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_vertexCapacityInput);
  std::__cxx11::string::~string((string *)&oss_vertexCapacityInput);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_vertexCapacityInput,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_vertexCapacityInput);
    std::__cxx11::string::~string((string *)&oss_vertexCapacityInput);
  }
  else {
    _oss_vertexCapacityInput = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_vertexCapacityInput);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_vertexCapacityInput);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_928,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_928,contents);
  std::__cxx11::string::~string((string *)&local_928);
  if (bVar2) {
    std::__cxx11::string::string((string *)&vertexcapacityinput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&vertexcapacityinput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertexCapacityInput);
    poVar4 = std::operator<<((ostream *)&oss_vertexCapacityInput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&vertexcapacityinput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_vertexCountOutput);
    std::__cxx11::string::~string((string *)&oss_vertexCountOutput);
    std::__cxx11::string::string((string *)&vertexcountoutput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&vertexcountoutput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertexCountOutput);
    poVar4 = std::operator<<((ostream *)&oss_vertexCountOutput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&vertexcountoutput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_vertices);
    std::__cxx11::string::~string((string *)&oss_vertices);
    std::__cxx11::string::string((string *)&vertices_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&vertices_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_vertices);
    *(uint *)((long)auStack_770 + *(long *)(_oss_vertices + -0x18)) =
         *(uint *)((long)auStack_770 + *(long *)(_oss_vertices + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_vertices);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])"XrVector2f*",&vertices_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_indexCapacityInput);
    std::__cxx11::string::~string((string *)&oss_indexCapacityInput);
    std::__cxx11::string::string((string *)&indexcapacityinput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&indexcapacityinput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_indexCapacityInput);
    poVar4 = std::operator<<((ostream *)&oss_indexCapacityInput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&indexcapacityinput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_indexCountOutput);
    std::__cxx11::string::~string((string *)&oss_indexCountOutput);
    std::__cxx11::string::string((string *)&indexcountoutput_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&indexcountoutput_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_indexCountOutput);
    poVar4 = std::operator<<((ostream *)&oss_indexCountOutput,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&indexcountoutput_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_indices);
    std::__cxx11::string::~string((string *)&oss_indices);
    std::__cxx11::string::string((string *)&indices_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&indices_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_indices);
    poVar4 = std::operator<<((ostream *)&oss_indices,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[10],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [10])0x2122c1,&indices_prefix,&local_948);
    std::__cxx11::string::~string((string *)&local_948);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_indices);
    std::__cxx11::string::~string((string *)&indices_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_indexCountOutput);
    std::__cxx11::string::~string((string *)&indexcountoutput_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_indexCapacityInput);
    std::__cxx11::string::~string((string *)&indexcapacityinput_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertices);
    std::__cxx11::string::~string((string *)&vertices_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertexCountOutput);
    std::__cxx11::string::~string((string *)&vertexcountoutput_prefix);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_vertexCapacityInput);
    std::__cxx11::string::~string((string *)&vertexcapacityinput_prefix);
    std::__cxx11::string::~string((string *)&next_prefix);
    std::__cxx11::string::~string((string *)&type_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrVisibilityMaskKHR* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string vertexcapacityinput_prefix = prefix;
        vertexcapacityinput_prefix += "vertexCapacityInput";
        std::ostringstream oss_vertexCapacityInput;
        oss_vertexCapacityInput << "0x" << std::hex << (value->vertexCapacityInput);
        contents.emplace_back("uint32_t", vertexcapacityinput_prefix, oss_vertexCapacityInput.str());
        std::string vertexcountoutput_prefix = prefix;
        vertexcountoutput_prefix += "vertexCountOutput";
        std::ostringstream oss_vertexCountOutput;
        oss_vertexCountOutput << "0x" << std::hex << (value->vertexCountOutput);
        contents.emplace_back("uint32_t", vertexcountoutput_prefix, oss_vertexCountOutput.str());
        std::string vertices_prefix = prefix;
        vertices_prefix += "vertices";
        std::ostringstream oss_vertices;
        oss_vertices << std::hex << reinterpret_cast<const void*>(value->vertices);
        contents.emplace_back("XrVector2f*", vertices_prefix, oss_vertices.str());
        std::string indexcapacityinput_prefix = prefix;
        indexcapacityinput_prefix += "indexCapacityInput";
        std::ostringstream oss_indexCapacityInput;
        oss_indexCapacityInput << "0x" << std::hex << (value->indexCapacityInput);
        contents.emplace_back("uint32_t", indexcapacityinput_prefix, oss_indexCapacityInput.str());
        std::string indexcountoutput_prefix = prefix;
        indexcountoutput_prefix += "indexCountOutput";
        std::ostringstream oss_indexCountOutput;
        oss_indexCountOutput << "0x" << std::hex << (value->indexCountOutput);
        contents.emplace_back("uint32_t", indexcountoutput_prefix, oss_indexCountOutput.str());
        std::string indices_prefix = prefix;
        indices_prefix += "indices";
        std::ostringstream oss_indices;
        oss_indices << "0x" << std::hex << (value->indices);
        contents.emplace_back("uint32_t*", indices_prefix, oss_indices.str());
        return true;
    } catch(...) {
    }
    return false;
}